

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Velocitizer.cpp
# Opt level: O0

void __thiscall OpenMD::Velocitizer::scale(Velocitizer *this,RealType lambda)

{
  bool bVar1;
  Vector3<double> *in_RDI;
  Velocitizer *in_XMM0_Qa;
  Vector3d j;
  Vector3d v;
  StuntDouble *sd;
  Molecule *mol;
  IntegrableObjectIterator ioi;
  MoleculeIterator mi;
  Velocitizer *in_stack_000001a0;
  StuntDouble *in_stack_ffffffffffffff70;
  StuntDouble *in_stack_ffffffffffffff78;
  StuntDouble *in_stack_ffffffffffffff80;
  iterator *in_stack_ffffffffffffff88;
  SimInfo *in_stack_ffffffffffffff90;
  StuntDouble *local_30;
  Molecule *local_28;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  local_20;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_18;
  
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_18);
  __gnu_cxx::
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  ::__normal_iterator(&local_20);
  Vector3<double>::Vector3((Vector3<double> *)0x323ec5);
  Vector3<double>::Vector3((Vector3<double> *)0x323ecf);
  local_28 = SimInfo::beginMolecule
                       (in_stack_ffffffffffffff90,(MoleculeIterator *)in_stack_ffffffffffffff88);
  while (local_28 != (Molecule *)0x0) {
    local_30 = Molecule::beginIntegrableObject
                         ((Molecule *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    while (local_30 != (StuntDouble *)0x0) {
      StuntDouble::getVel(in_stack_ffffffffffffff78);
      Vector3<double>::operator=((Vector3<double> *)in_stack_ffffffffffffff70,in_RDI);
      Vector<double,_3U>::operator*=((Vector<double,_3U> *)in_stack_ffffffffffffff70,(double)in_RDI)
      ;
      StuntDouble::setVel(in_stack_ffffffffffffff80,(Vector3d *)in_stack_ffffffffffffff78);
      bVar1 = StuntDouble::isDirectional(in_stack_ffffffffffffff70);
      if (bVar1) {
        StuntDouble::getJ(in_stack_ffffffffffffff78);
        Vector3<double>::operator=((Vector3<double> *)in_stack_ffffffffffffff70,in_RDI);
        Vector<double,_3U>::operator*=
                  ((Vector<double,_3U> *)in_stack_ffffffffffffff70,(double)in_RDI);
        StuntDouble::setJ(in_stack_ffffffffffffff80,(Vector3d *)in_stack_ffffffffffffff78);
      }
      local_30 = Molecule::nextIntegrableObject
                           ((Molecule *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    local_28 = SimInfo::nextMolecule
                         (in_stack_ffffffffffffff90,(MoleculeIterator *)in_stack_ffffffffffffff88);
  }
  removeComDrift(in_XMM0_Qa);
  bVar1 = Globals::getUsePeriodicBoundaryConditions((Globals *)0x323ff7);
  if (!bVar1) {
    removeAngularDrift(in_stack_000001a0);
  }
  return;
}

Assistant:

void Velocitizer::scale(RealType lambda) {
    SimInfo::MoleculeIterator mi;
    Molecule::IntegrableObjectIterator ioi;
    Molecule* mol;
    StuntDouble* sd;
    Vector3d v, j;

    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (sd = mol->beginIntegrableObject(ioi); sd != NULL;
           sd = mol->nextIntegrableObject(ioi)) {
        v = sd->getVel();
        v *= lambda;
        sd->setVel(v);

        if (sd->isDirectional()) {
          j = sd->getJ();
          j *= lambda;
          sd->setJ(j);
        }
      }
    }

    removeComDrift();

    // Remove angular drift if we are not using periodic boundary
    // conditions:

    if (!globals_->getUsePeriodicBoundaryConditions()) removeAngularDrift();
  }